

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<iutest::detail::iuFilePath,char[1]>
          (string *__return_storage_ptr__,internal *this,iuFilePath *value,char (*param_2) [1])

{
  char (*param_1_local) [1];
  iuFilePath *value_local;
  
  PrintToString<iutest::detail::iuFilePath>(__return_storage_ptr__,(iuFilePath *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}